

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_is_dir(char *file,wchar_t line,char *pathname,wchar_t mode)

{
  int iVar1;
  char *fmt;
  stat st;
  stat sStack_b8;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = lstat(pathname,&sStack_b8);
  if (iVar1 == 0) {
    if ((sStack_b8.st_mode & 0xf000) == 0x4000) {
      if ((sStack_b8.st_mode & 0xfff) == mode || mode < L'\0') {
        return L'\x01';
      }
      failure_start(file,line,"Dir %s has wrong mode",pathname);
      logprintf("  Expected: 0%3o\n",(ulong)(uint)mode);
      file = "  Found: 0%3o\n";
      logprintf("  Found: 0%3o\n",(ulong)(sStack_b8.st_mode & 0xfff));
      goto LAB_001042de;
    }
    fmt = "%s is not a dir";
  }
  else {
    fmt = "Dir should exist: %s";
  }
  failure_start(file,line,fmt,pathname);
LAB_001042de:
  failure_finish(file);
  return L'\0';
}

Assistant:

int
assertion_is_dir(const char *file, int line, const char *pathname, int mode)
{
	struct stat st;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)mode; /* UNUSED */
#endif
	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line, "Dir should exist: %s", pathname);
		failure_finish(NULL);
		return (0);
	}
	if (!S_ISDIR(st.st_mode)) {
		failure_start(file, line, "%s is not a dir", pathname);
		failure_finish(NULL);
		return (0);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	/* Windows doesn't handle permissions the same way as POSIX,
	 * so just ignore the mode tests. */
	/* TODO: Can we do better here? */
	if (mode >= 0 && (mode_t)mode != (st.st_mode & 07777)) {
		failure_start(file, line, "Dir %s has wrong mode", pathname);
		logprintf("  Expected: 0%3o\n", (unsigned int)mode);
		logprintf("  Found: 0%3o\n", (unsigned int)st.st_mode & 07777);
		failure_finish(NULL);
		return (0);
	}
#endif
	return (1);
}